

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  LodePNGColorType LVar1;
  byte bVar2;
  LodePNGColorProfile *pLVar3;
  byte bVar4;
  int iVar5;
  byte bVar6;
  undefined4 in_register_0000000c;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  undefined7 uVar12;
  byte bVar13;
  size_t sVar14;
  bool bVar15;
  bool bVar16;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_11e;
  unsigned_short local_11c;
  unsigned_short local_11a;
  unsigned_short local_118;
  byte local_115;
  byte local_114;
  byte local_113;
  byte local_112;
  byte local_111;
  LodePNGColorProfile *local_110;
  ulong local_108;
  uint local_100;
  uint local_fc;
  uchar *local_f8;
  LodePNGColorMode *local_f0;
  uint local_e4;
  ulong local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  size_t local_c8;
  size_t local_c0;
  ColorTree local_b8;
  
  local_108 = CONCAT44(in_register_0000000c,h);
  LVar1 = mode->colortype;
  bVar15 = (LVar1 & ~LCT_GREY_ALPHA) == LCT_GREY;
  local_f8 = in;
  local_100 = lodepng_can_have_alpha(mode);
  iVar5 = 0;
  if ((ulong)LVar1 < 7) {
    iVar5 = *(int *)(&DAT_00113b44 + (ulong)LVar1 * 4);
  }
  local_108 = (ulong)((int)local_108 * w);
  uVar9 = iVar5 * mode->bitdepth;
  local_fc = 2;
  if (8 < uVar9) {
    local_fc = 0x101;
  }
  if (((8 >= uVar9 && uVar9 != 1) && (local_fc = 4, uVar9 != 2)) && (local_fc = 0x100, uVar9 == 4))
  {
    local_fc = 0x10;
  }
  local_100 = local_100 ^ 1;
  local_b8.children[0xe] = (ColorTree *)0x0;
  local_b8.children[0xf] = (ColorTree *)0x0;
  local_b8.children[0xc] = (ColorTree *)0x0;
  local_b8.children[0xd] = (ColorTree *)0x0;
  local_b8.children[10] = (ColorTree *)0x0;
  local_b8.children[0xb] = (ColorTree *)0x0;
  local_b8.children[8] = (ColorTree *)0x0;
  local_b8.children[9] = (ColorTree *)0x0;
  local_b8.children[6] = (ColorTree *)0x0;
  local_b8.children[7] = (ColorTree *)0x0;
  local_b8.children[4] = (ColorTree *)0x0;
  local_b8.children[5] = (ColorTree *)0x0;
  local_b8.children[2] = (ColorTree *)0x0;
  local_b8.children[3] = (ColorTree *)0x0;
  local_b8.children[0] = (ColorTree *)0x0;
  local_b8.children[1] = (ColorTree *)0x0;
  local_b8.index = -1;
  local_110 = profile;
  local_f0 = mode;
  if ((mode->bitdepth == 0x10) && (local_108 != 0)) {
    sVar14 = 0;
    do {
      getPixelColorRGBA16(&local_11a,&local_11c,&local_11e,&local_118,local_f8,sVar14,local_f0);
      if ((((local_11a & 0xff) != local_11a >> 8) || ((local_11c & 0xff) != local_11c >> 8)) ||
         (((local_11e & 0xff) != local_11e >> 8 || ((local_118 & 0xff) != local_118 >> 8)))) {
        local_11a = 0;
        local_11c = 0;
        local_11e = 0;
        local_118 = 0;
        profile->bits = 0x10;
        sVar14 = local_108 - 1;
        sVar10 = 0;
        uVar9 = local_100;
        goto LAB_0010b587;
      }
      sVar14 = sVar14 + 1;
    } while (local_108 != sVar14);
  }
  uVar8 = 0;
  local_11a = local_11a & 0xff00;
  local_11c = local_11c & 0xff00;
  local_11e = local_11e & 0xff00;
  local_118 = local_118 & 0xff00;
  if (local_108 != 0) {
    local_c8 = local_108 - 1;
    sVar14 = 0;
    local_cc = uVar9;
    bVar4 = uVar9 == 1;
    do {
      uVar9 = local_cc;
      sVar10 = sVar14;
      local_e0 = uVar8;
      getPixelColorRGBA8((uchar *)&local_11a,(uchar *)&local_11c,(uchar *)&local_11e,
                         (uchar *)&local_118,local_f8,sVar14,local_f0);
      if (((bVar4 & 1) == 0) && (profile->bits < 8)) {
        uVar7 = 1;
        if (1 < (byte)((byte)local_11a + 1)) {
          uVar7 = 8;
          if ((uint)(byte)local_11a * -0xf0f0f0f < 0xf0f0f10) {
            uVar7 = (uint)(0x3030303 < (uint)(byte)local_11a * -0x3030303) * 2 + 2;
          }
        }
        if (profile->bits < uVar7) {
          profile->bits = uVar7;
        }
      }
      uVar7 = profile->bits;
      local_111 = uVar9 <= uVar7;
      uVar11 = CONCAT71((int7)(sVar10 >> 8),1);
      bVar16 = !bVar15;
      bVar6 = (byte)local_11c;
      bVar4 = (byte)local_11e;
      bVar15 = true;
      if (bVar16) {
        if ((byte)local_11a == (byte)local_11c) {
          uVar11 = 0;
          bVar15 = false;
          if ((byte)local_11a == (byte)local_11e) goto LAB_0010b1f7;
        }
        profile->colored = 1;
        uVar12 = (undefined7)(uVar11 >> 8);
        uVar11 = CONCAT71(uVar12,1);
        bVar15 = true;
        if (uVar7 < 8) {
          profile->bits = 8;
          uVar11 = CONCAT71(uVar12,1);
        }
      }
LAB_0010b1f7:
      bVar2 = (byte)local_118;
      if (local_100 == 0) {
        if ((profile->key_r == (local_11a & 0xff)) && (profile->key_g == (local_11c & 0xff))) {
          bVar16 = profile->key_b == (local_11e & 0xff);
        }
        else {
          bVar16 = false;
        }
        if ((byte)local_118 == 0xff) {
          bVar13 = 0;
          local_100 = 0;
          if ((bool)(profile->key != 0 & bVar16)) {
            profile->alpha = 1;
            uVar9 = profile->bits;
            goto joined_r0x0010b3e8;
          }
        }
        else {
          if (((byte)local_118 != 0) || (!(bool)(profile->key == 0 | bVar16))) {
            profile->alpha = 1;
            uVar9 = profile->bits;
joined_r0x0010b3e8:
            if (uVar9 < 8) {
              profile->bits = 8;
            }
            goto LAB_0010b205;
          }
          local_100 = 0;
          if ((profile->alpha == 0) && (profile->key == 0)) {
            profile->key = 1;
            profile->key_r = local_11a & 0xff;
            profile->key_g = local_11c & 0xff;
            profile->key_b = local_11e & 0xff;
            bVar13 = 0;
            local_100 = 0;
          }
          else {
            bVar13 = 0;
          }
        }
      }
      else {
LAB_0010b205:
        bVar13 = 1;
        local_100 = 1;
      }
      uVar8 = 1;
      local_c0 = sVar14;
      if ((uint)local_e0 == 0) {
        local_113 = (byte)local_11a;
        local_112 = (byte)local_11c;
        local_d0 = (uint)(byte)local_11a;
        local_e0 = CONCAT44(local_e0._4_4_,uVar7);
        local_d4 = (uint)(byte)local_118;
        local_e4 = (uint)uVar11;
        iVar5 = color_tree_get(&local_b8,(byte)local_11a,(byte)local_11c,(byte)local_11e,
                               (byte)local_118);
        pLVar3 = local_110;
        uVar11 = (ulong)local_e4;
        uVar8 = 0;
        uVar7 = (uint)local_e0;
        if (iVar5 < 0) {
          local_115 = bVar2;
          local_114 = bVar4;
          color_tree_add(&local_b8,(uchar)local_d0,bVar6,bVar4,(uchar)local_d4,local_110->numcolors)
          ;
          uVar9 = pLVar3->numcolors;
          if ((ulong)uVar9 < 0x100) {
            uVar8 = (ulong)(uVar9 * 4);
            pLVar3->palette[(ulong)uVar9 * 4] = local_113;
            pLVar3->palette[uVar8 + 1] = local_112;
            pLVar3->palette[uVar8 + 2] = local_114;
            pLVar3->palette[uVar8 + 3] = local_115;
          }
          pLVar3->numcolors = uVar9 + 1;
          uVar8 = (ulong)(local_fc <= uVar9 + 1);
          uVar11 = (ulong)local_e4;
          uVar7 = (uint)local_e0;
        }
      }
      profile = local_110;
    } while ((((byte)uVar11 & bVar13 & (byte)uVar8 & local_cc <= uVar7) == 0) &&
            (sVar14 = local_c0 + 1, bVar4 = local_111, local_c8 != local_c0));
  }
  if ((profile->key != 0) && (local_108 != 0 && local_110->alpha == 0)) {
    sVar14 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_11a,(uchar *)&local_11c,(uchar *)&local_11e,
                         (uchar *)&local_118,local_f8,sVar14,local_f0);
      if (((((byte)local_118 != '\0') && (local_110->key_r == (local_11a & 0xff))) &&
          (local_110->key_g == (local_11c & 0xff))) && (local_110->key_b == (local_11e & 0xff))) {
        local_110->alpha = 1;
      }
      sVar14 = sVar14 + 1;
    } while (local_108 != sVar14);
  }
  iVar5._0_2_ = local_110->key_r;
  iVar5._2_2_ = local_110->key_g;
  local_110->key_r = (short)(iVar5 << 8) + (undefined2)iVar5;
  local_110->key_g = local_110->key_g * 0x101;
  local_110->key_b = (short)(*(int *)&local_110->key_b << 8) + (short)*(int *)&local_110->key_b;
LAB_0010b527:
  color_tree_cleanup(&local_b8);
  return 0;
  while ((!(bool)(bVar4 & bVar6) && (bVar16 = sVar14 != sVar10, sVar10 = sVar10 + 1, bVar16))) {
LAB_0010b587:
    getPixelColorRGBA16(&local_11a,&local_11c,&local_11e,&local_118,local_f8,sVar10,local_f0);
    bVar4 = 1;
    bVar16 = !bVar15;
    bVar15 = true;
    if (bVar16) {
      if (local_11a == local_11c) {
        bVar4 = 0;
        bVar15 = false;
        if (local_11a == local_11e) goto LAB_0010b5e5;
      }
      profile->colored = 1;
      bVar4 = 1;
      bVar15 = true;
    }
LAB_0010b5e5:
    if (uVar9 == 0) {
      if ((local_11a == profile->key_r) && (local_11c == profile->key_g)) {
        bVar16 = local_11e == profile->key_b;
      }
      else {
        bVar16 = false;
      }
      if (local_118 == 0xffff) {
        bVar6 = 0;
        uVar9 = 0;
        if ((bool)(profile->key != 0 & bVar16)) {
          profile->alpha = 1;
          goto LAB_0010b6b3;
        }
      }
      else {
        if ((local_118 != 0) || (!(bool)(profile->key == 0 | bVar16))) {
          profile->alpha = 1;
          if (profile->bits < 8) {
            profile->bits = 8;
          }
          goto LAB_0010b6b3;
        }
        uVar9 = 0;
        if ((profile->alpha == 0) && (profile->key == 0)) {
          profile->key = 1;
          profile->key_r = local_11a;
          profile->key_g = local_11c;
          profile->key_b = local_11e;
          bVar6 = 0;
        }
        else {
          bVar6 = 0;
        }
      }
    }
    else {
LAB_0010b6b3:
      bVar6 = 1;
      uVar9 = 1;
    }
  }
  if ((profile->key != 0) && (local_110->alpha == 0)) {
    sVar14 = 0;
    do {
      getPixelColorRGBA16(&local_11a,&local_11c,&local_11e,&local_118,local_f8,sVar14,local_f0);
      if ((((local_118 != 0) && (local_11a == local_110->key_r)) && (local_11c == local_110->key_g))
         && (local_11e == local_110->key_b)) {
        local_110->alpha = 1;
      }
      sVar14 = sVar14 + 1;
    } while (local_108 != sVar14);
  }
  goto LAB_0010b527;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}